

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSHcode Curl_share_lock(Curl_easy *data,curl_lock_data type,curl_lock_access accesstype)

{
  Curl_share *pCVar1;
  CURLSHcode CVar2;
  
  pCVar1 = data->share;
  if (pCVar1 == (Curl_share *)0x0) {
    CVar2 = CURLSHE_INVALID;
  }
  else {
    CVar2 = CURLSHE_OK;
    if (((pCVar1->specifier >> (type & 0x1f) & 1) != 0) &&
       (pCVar1->lockfunc != (curl_lock_function)0x0)) {
      (*pCVar1->lockfunc)(data,type,accesstype,pCVar1->clientdata);
      CVar2 = CURLSHE_OK;
    }
  }
  return CVar2;
}

Assistant:

CURLSHcode
Curl_share_lock(struct Curl_easy *data, curl_lock_data type,
                curl_lock_access accesstype)
{
  struct Curl_share *share = data->share;

  if(share == NULL)
    return CURLSHE_INVALID;

  if(share->specifier & (1<<type)) {
    if(share->lockfunc) /* only call this if set! */
      share->lockfunc(data, type, accesstype, share->clientdata);
  }
  /* else if we don't share this, pretend successful lock */

  return CURLSHE_OK;
}